

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

void __thiscall
OpenMD::Polynomial<double>::addCoefficient
          (Polynomial<double> *this,int exponent,double *coefficient)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict mVar2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int local_4;
  
  p_Var1 = &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < exponent])
  {
    if (exponent <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, exponent < (int)p_Var4[1]._M_color)
     ) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    mVar2 = *coefficient;
    local_4 = exponent;
    pmVar3 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](&this->polyPairMap_,&local_4);
    *pmVar3 = mVar2;
  }
  else {
    p_Var5[1]._M_parent = (_Base_ptr)(*coefficient + (double)p_Var5[1]._M_parent);
  }
  return;
}

Assistant:

void addCoefficient(int exponent, const Real& coefficient) {
      iterator i = polyPairMap_.find(exponent);

      if (i != end()) {
        i->second += coefficient;
      } else {
        setCoefficient(exponent, coefficient);
      }
    }